

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int quicly_encode_transport_parameter_list
              (ptls_buffer_t *buf,quicly_transport_parameters_t *params,quicly_cid_t *original_dcid,
              quicly_cid_t *initial_scid,quicly_cid_t *retry_scid,void *stateless_reset_token,
              size_t expand_by)

{
  int iVar1;
  uint8_t *puVar2;
  long in_RCX;
  long in_RDX;
  long *in_RSI;
  long *in_RDI;
  long in_R8;
  long in_R9;
  size_t in_stack_00000008;
  size_t body_size_17;
  size_t body_start_17;
  size_t capacity_17;
  uint8_t *d_29;
  size_t body_size_16;
  uint8_t *d_28;
  size_t body_start_16;
  size_t capacity_16;
  uint8_t *d_27;
  size_t body_size_15;
  uint8_t *d_26;
  size_t body_start_15;
  size_t capacity_15;
  uint8_t *d_25;
  size_t body_size_14;
  size_t body_start_14;
  size_t capacity_14;
  uint8_t *d_24;
  size_t body_size_13;
  uint8_t *d_23;
  size_t body_start_13;
  size_t capacity_13;
  uint8_t *d_22;
  size_t body_size_12;
  uint8_t *d_21;
  size_t body_start_12;
  size_t capacity_12;
  uint8_t *d_20;
  size_t body_size_11;
  uint8_t *d_19;
  size_t body_start_11;
  size_t capacity_11;
  uint8_t *d_18;
  size_t body_size_10;
  uint8_t *d_17;
  size_t body_start_10;
  size_t capacity_10;
  uint8_t *d_16;
  size_t body_size_9;
  size_t body_start_9;
  size_t capacity_9;
  uint8_t *d_15;
  size_t body_size_8;
  size_t body_start_8;
  size_t capacity_8;
  uint8_t *d_14;
  size_t body_size_7;
  size_t body_start_7;
  size_t capacity_7;
  uint8_t *d_13;
  size_t body_size_6;
  size_t body_start_6;
  size_t capacity_6;
  uint8_t *d_12;
  size_t body_size_5;
  uint8_t *d_11;
  size_t body_start_5;
  size_t capacity_5;
  uint8_t *d_10;
  size_t body_size_4;
  uint8_t *d_9;
  size_t body_start_4;
  size_t capacity_4;
  uint8_t *d_8;
  size_t body_size_3;
  uint8_t *d_7;
  size_t body_start_3;
  size_t capacity_3;
  uint8_t *d_6;
  size_t body_size_2;
  uint8_t *d_5;
  size_t body_start_2;
  size_t capacity_2;
  uint8_t *d_4;
  size_t body_size_1;
  uint8_t *d_3;
  size_t body_start_1;
  size_t capacity_1;
  uint8_t *d_2;
  size_t body_size;
  uint8_t *d_1;
  size_t body_start;
  size_t capacity;
  uint8_t *d;
  int ret;
  uint64_t in_stack_fffffffffffffc08;
  uint8_t *in_stack_fffffffffffffc10;
  long *delta;
  ptls_buffer_t *in_stack_fffffffffffffc18;
  long *in_stack_fffffffffffffc20;
  ptls_buffer_t *in_stack_fffffffffffffc28;
  ptls_buffer_t *buf_00;
  int local_34;
  
  local_34 = ptls_buffer_reserve(in_stack_fffffffffffffc18,(size_t)in_stack_fffffffffffffc10);
  if (local_34 == 0) {
    puVar2 = ptls_encode_quicint(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
    in_RDI[2] = (long)puVar2 - *in_RDI;
    local_34 = ptls_buffer__do_pushv
                         (in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
                          in_stack_fffffffffffffc08);
    if ((local_34 == 0) &&
       (local_34 = ptls_buffer_reserve(in_stack_fffffffffffffc18,(size_t)in_stack_fffffffffffffc10),
       local_34 == 0)) {
      puVar2 = ptls_encode_quicint(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
      in_RDI[2] = (long)puVar2 - *in_RDI;
      local_34 = ptls_buffer__adjust_quic_blocksize
                           (in_stack_fffffffffffffc28,(size_t)in_stack_fffffffffffffc20);
      if (local_34 == 0) {
        if (*in_RSI != 0) {
          iVar1 = ptls_buffer_reserve(in_stack_fffffffffffffc18,(size_t)in_stack_fffffffffffffc10);
          if (iVar1 != 0) {
            return iVar1;
          }
          puVar2 = ptls_encode_quicint(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
          in_RDI[2] = (long)puVar2 - *in_RDI;
          iVar1 = ptls_buffer__do_pushv
                            (in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
                             in_stack_fffffffffffffc08);
          if (iVar1 != 0) {
            return iVar1;
          }
          iVar1 = ptls_buffer_reserve(in_stack_fffffffffffffc18,(size_t)in_stack_fffffffffffffc10);
          if (iVar1 != 0) {
            return iVar1;
          }
          puVar2 = ptls_encode_quicint(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
          in_RDI[2] = (long)puVar2 - *in_RDI;
          iVar1 = ptls_buffer__adjust_quic_blocksize
                            (in_stack_fffffffffffffc28,(size_t)in_stack_fffffffffffffc20);
          if (iVar1 != 0) {
            return iVar1;
          }
        }
        if (in_RSI[1] != 0) {
          iVar1 = ptls_buffer_reserve(in_stack_fffffffffffffc18,(size_t)in_stack_fffffffffffffc10);
          if (iVar1 != 0) {
            return iVar1;
          }
          puVar2 = ptls_encode_quicint(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
          in_RDI[2] = (long)puVar2 - *in_RDI;
          iVar1 = ptls_buffer__do_pushv
                            (in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
                             in_stack_fffffffffffffc08);
          if (iVar1 != 0) {
            return iVar1;
          }
          iVar1 = ptls_buffer_reserve(in_stack_fffffffffffffc18,(size_t)in_stack_fffffffffffffc10);
          if (iVar1 != 0) {
            return iVar1;
          }
          puVar2 = ptls_encode_quicint(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
          in_RDI[2] = (long)puVar2 - *in_RDI;
          iVar1 = ptls_buffer__adjust_quic_blocksize
                            (in_stack_fffffffffffffc28,(size_t)in_stack_fffffffffffffc20);
          if (iVar1 != 0) {
            return iVar1;
          }
        }
        if (in_RSI[2] != 0) {
          iVar1 = ptls_buffer_reserve(in_stack_fffffffffffffc18,(size_t)in_stack_fffffffffffffc10);
          if (iVar1 != 0) {
            return iVar1;
          }
          puVar2 = ptls_encode_quicint(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
          in_RDI[2] = (long)puVar2 - *in_RDI;
          iVar1 = ptls_buffer__do_pushv
                            (in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
                             in_stack_fffffffffffffc08);
          if (iVar1 != 0) {
            return iVar1;
          }
          iVar1 = ptls_buffer_reserve(in_stack_fffffffffffffc18,(size_t)in_stack_fffffffffffffc10);
          if (iVar1 != 0) {
            return iVar1;
          }
          puVar2 = ptls_encode_quicint(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
          in_RDI[2] = (long)puVar2 - *in_RDI;
          iVar1 = ptls_buffer__adjust_quic_blocksize
                            (in_stack_fffffffffffffc28,(size_t)in_stack_fffffffffffffc20);
          if (iVar1 != 0) {
            return iVar1;
          }
        }
        if (in_RSI[3] != 0) {
          iVar1 = ptls_buffer_reserve(in_stack_fffffffffffffc18,(size_t)in_stack_fffffffffffffc10);
          if (iVar1 != 0) {
            return iVar1;
          }
          puVar2 = ptls_encode_quicint(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
          in_RDI[2] = (long)puVar2 - *in_RDI;
          iVar1 = ptls_buffer__do_pushv
                            (in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
                             in_stack_fffffffffffffc08);
          if (iVar1 != 0) {
            return iVar1;
          }
          iVar1 = ptls_buffer_reserve(in_stack_fffffffffffffc18,(size_t)in_stack_fffffffffffffc10);
          if (iVar1 != 0) {
            return iVar1;
          }
          puVar2 = ptls_encode_quicint(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
          in_RDI[2] = (long)puVar2 - *in_RDI;
          iVar1 = ptls_buffer__adjust_quic_blocksize
                            (in_stack_fffffffffffffc28,(size_t)in_stack_fffffffffffffc20);
          if (iVar1 != 0) {
            return iVar1;
          }
        }
        if (in_RSI[4] != 0) {
          iVar1 = ptls_buffer_reserve(in_stack_fffffffffffffc18,(size_t)in_stack_fffffffffffffc10);
          if (iVar1 != 0) {
            return iVar1;
          }
          puVar2 = ptls_encode_quicint(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
          in_RDI[2] = (long)puVar2 - *in_RDI;
          iVar1 = ptls_buffer__do_pushv
                            (in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
                             in_stack_fffffffffffffc08);
          if (iVar1 != 0) {
            return iVar1;
          }
          iVar1 = ptls_buffer_reserve(in_stack_fffffffffffffc18,(size_t)in_stack_fffffffffffffc10);
          if (iVar1 != 0) {
            return iVar1;
          }
          puVar2 = ptls_encode_quicint(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
          in_RDI[2] = (long)puVar2 - *in_RDI;
          iVar1 = ptls_buffer__adjust_quic_blocksize
                            (in_stack_fffffffffffffc28,(size_t)in_stack_fffffffffffffc20);
          if (iVar1 != 0) {
            return iVar1;
          }
        }
        if (in_RDX != 0) {
          iVar1 = ptls_buffer_reserve(in_stack_fffffffffffffc18,(size_t)in_stack_fffffffffffffc10);
          if (iVar1 != 0) {
            return iVar1;
          }
          puVar2 = ptls_encode_quicint(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
          in_RDI[2] = (long)puVar2 - *in_RDI;
          iVar1 = ptls_buffer__do_pushv
                            (in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
                             in_stack_fffffffffffffc08);
          if (iVar1 != 0) {
            return iVar1;
          }
          iVar1 = ptls_buffer__do_pushv
                            (in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
                             in_stack_fffffffffffffc08);
          if (iVar1 != 0) {
            return iVar1;
          }
          iVar1 = ptls_buffer__adjust_quic_blocksize
                            (in_stack_fffffffffffffc28,(size_t)in_stack_fffffffffffffc20);
          if (iVar1 != 0) {
            return iVar1;
          }
        }
        if (in_RCX != 0) {
          iVar1 = ptls_buffer_reserve(in_stack_fffffffffffffc18,(size_t)in_stack_fffffffffffffc10);
          if (iVar1 != 0) {
            return iVar1;
          }
          puVar2 = ptls_encode_quicint(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
          in_RDI[2] = (long)puVar2 - *in_RDI;
          iVar1 = ptls_buffer__do_pushv
                            (in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
                             in_stack_fffffffffffffc08);
          if (iVar1 != 0) {
            return iVar1;
          }
          iVar1 = ptls_buffer__do_pushv
                            (in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
                             in_stack_fffffffffffffc08);
          if (iVar1 != 0) {
            return iVar1;
          }
          iVar1 = ptls_buffer__adjust_quic_blocksize
                            (in_stack_fffffffffffffc28,(size_t)in_stack_fffffffffffffc20);
          if (iVar1 != 0) {
            return iVar1;
          }
        }
        if (in_R8 != 0) {
          iVar1 = ptls_buffer_reserve(in_stack_fffffffffffffc18,(size_t)in_stack_fffffffffffffc10);
          if (iVar1 != 0) {
            return iVar1;
          }
          puVar2 = ptls_encode_quicint(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
          in_RDI[2] = (long)puVar2 - *in_RDI;
          iVar1 = ptls_buffer__do_pushv
                            (in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
                             in_stack_fffffffffffffc08);
          if (iVar1 != 0) {
            return iVar1;
          }
          iVar1 = ptls_buffer__do_pushv
                            (in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
                             in_stack_fffffffffffffc08);
          if (iVar1 != 0) {
            return iVar1;
          }
          iVar1 = ptls_buffer__adjust_quic_blocksize
                            (in_stack_fffffffffffffc28,(size_t)in_stack_fffffffffffffc20);
          if (iVar1 != 0) {
            return iVar1;
          }
        }
        if (in_R9 != 0) {
          iVar1 = ptls_buffer_reserve(in_stack_fffffffffffffc18,(size_t)in_stack_fffffffffffffc10);
          if (iVar1 != 0) {
            return iVar1;
          }
          puVar2 = ptls_encode_quicint(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
          in_RDI[2] = (long)puVar2 - *in_RDI;
          iVar1 = ptls_buffer__do_pushv
                            (in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
                             in_stack_fffffffffffffc08);
          if (iVar1 != 0) {
            return iVar1;
          }
          iVar1 = ptls_buffer__do_pushv
                            (in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
                             in_stack_fffffffffffffc08);
          if (iVar1 != 0) {
            return iVar1;
          }
          iVar1 = ptls_buffer__adjust_quic_blocksize
                            (in_stack_fffffffffffffc28,(size_t)in_stack_fffffffffffffc20);
          if (iVar1 != 0) {
            return iVar1;
          }
        }
        if (in_RSI[5] != 0) {
          iVar1 = ptls_buffer_reserve(in_stack_fffffffffffffc18,(size_t)in_stack_fffffffffffffc10);
          if (iVar1 != 0) {
            return iVar1;
          }
          puVar2 = ptls_encode_quicint(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
          in_RDI[2] = (long)puVar2 - *in_RDI;
          iVar1 = ptls_buffer__do_pushv
                            (in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
                             in_stack_fffffffffffffc08);
          if (iVar1 != 0) {
            return iVar1;
          }
          iVar1 = ptls_buffer_reserve(in_stack_fffffffffffffc18,(size_t)in_stack_fffffffffffffc10);
          if (iVar1 != 0) {
            return iVar1;
          }
          puVar2 = ptls_encode_quicint(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
          in_RDI[2] = (long)puVar2 - *in_RDI;
          iVar1 = ptls_buffer__adjust_quic_blocksize
                            (in_stack_fffffffffffffc28,(size_t)in_stack_fffffffffffffc20);
          if (iVar1 != 0) {
            return iVar1;
          }
        }
        if (in_RSI[6] != 0) {
          iVar1 = ptls_buffer_reserve(in_stack_fffffffffffffc18,(size_t)in_stack_fffffffffffffc10);
          if (iVar1 != 0) {
            return iVar1;
          }
          puVar2 = ptls_encode_quicint(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
          in_RDI[2] = (long)puVar2 - *in_RDI;
          iVar1 = ptls_buffer__do_pushv
                            (in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
                             in_stack_fffffffffffffc08);
          if (iVar1 != 0) {
            return iVar1;
          }
          iVar1 = ptls_buffer_reserve(in_stack_fffffffffffffc18,(size_t)in_stack_fffffffffffffc10);
          if (iVar1 != 0) {
            return iVar1;
          }
          puVar2 = ptls_encode_quicint(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
          in_RDI[2] = (long)puVar2 - *in_RDI;
          iVar1 = ptls_buffer__adjust_quic_blocksize
                            (in_stack_fffffffffffffc28,(size_t)in_stack_fffffffffffffc20);
          if (iVar1 != 0) {
            return iVar1;
          }
        }
        local_34 = ptls_buffer_reserve(in_stack_fffffffffffffc18,(size_t)in_stack_fffffffffffffc10);
        if (local_34 == 0) {
          puVar2 = ptls_encode_quicint(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
          in_RDI[2] = (long)puVar2 - *in_RDI;
          local_34 = ptls_buffer__do_pushv
                               (in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
                                in_stack_fffffffffffffc08);
          if ((local_34 == 0) &&
             (local_34 = ptls_buffer_reserve(in_stack_fffffffffffffc18,
                                             (size_t)in_stack_fffffffffffffc10), local_34 == 0)) {
            puVar2 = ptls_encode_quicint(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
            in_RDI[2] = (long)puVar2 - *in_RDI;
            local_34 = ptls_buffer__adjust_quic_blocksize
                                 (in_stack_fffffffffffffc28,(size_t)in_stack_fffffffffffffc20);
            if (local_34 == 0) {
              if (in_RSI[9] != -1) {
                iVar1 = ptls_buffer_reserve(in_stack_fffffffffffffc18,
                                            (size_t)in_stack_fffffffffffffc10);
                if (iVar1 != 0) {
                  return iVar1;
                }
                puVar2 = ptls_encode_quicint(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
                in_RDI[2] = (long)puVar2 - *in_RDI;
                iVar1 = ptls_buffer__do_pushv
                                  (in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
                                   in_stack_fffffffffffffc08);
                if (iVar1 != 0) {
                  return iVar1;
                }
                iVar1 = ptls_buffer_reserve(in_stack_fffffffffffffc18,
                                            (size_t)in_stack_fffffffffffffc10);
                if (iVar1 != 0) {
                  return iVar1;
                }
                puVar2 = ptls_encode_quicint(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
                in_RDI[2] = (long)puVar2 - *in_RDI;
                iVar1 = ptls_buffer__adjust_quic_blocksize
                                  (in_stack_fffffffffffffc28,(size_t)in_stack_fffffffffffffc20);
                if (iVar1 != 0) {
                  return iVar1;
                }
              }
              if ((*(byte *)(in_RSI + 10) & 1) != 0) {
                iVar1 = ptls_buffer_reserve(in_stack_fffffffffffffc18,
                                            (size_t)in_stack_fffffffffffffc10);
                if (iVar1 != 0) {
                  return iVar1;
                }
                puVar2 = ptls_encode_quicint(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
                in_RDI[2] = (long)puVar2 - *in_RDI;
                iVar1 = ptls_buffer__do_pushv
                                  (in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
                                   in_stack_fffffffffffffc08);
                if (iVar1 != 0) {
                  return iVar1;
                }
                iVar1 = ptls_buffer__adjust_quic_blocksize
                                  (in_stack_fffffffffffffc28,(size_t)in_stack_fffffffffffffc20);
                if (iVar1 != 0) {
                  return iVar1;
                }
              }
              local_34 = ptls_buffer_reserve(in_stack_fffffffffffffc18,
                                             (size_t)in_stack_fffffffffffffc10);
              if (local_34 == 0) {
                puVar2 = ptls_encode_quicint(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
                in_RDI[2] = (long)puVar2 - *in_RDI;
                buf_00 = (ptls_buffer_t *)0x1;
                local_34 = ptls_buffer__do_pushv
                                     (in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
                                      in_stack_fffffffffffffc08);
                if ((local_34 == 0) &&
                   (local_34 = ptls_buffer_reserve(in_stack_fffffffffffffc18,
                                                   (size_t)in_stack_fffffffffffffc10), local_34 == 0
                   )) {
                  puVar2 = ptls_encode_quicint(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
                  in_RDI[2] = (long)puVar2 - *in_RDI;
                  local_34 = ptls_buffer__adjust_quic_blocksize
                                       (buf_00,(size_t)in_stack_fffffffffffffc20);
                  if (local_34 == 0) {
                    if ((short)in_RSI[0xc] != 0) {
                      iVar1 = ptls_buffer_reserve(in_stack_fffffffffffffc18,
                                                  (size_t)in_stack_fffffffffffffc10);
                      if (iVar1 != 0) {
                        return iVar1;
                      }
                      puVar2 = ptls_encode_quicint(in_stack_fffffffffffffc10,
                                                   in_stack_fffffffffffffc08);
                      in_RDI[2] = (long)puVar2 - *in_RDI;
                      in_stack_fffffffffffffc18 = (ptls_buffer_t *)0x1;
                      in_stack_fffffffffffffc20 = in_RDI;
                      iVar1 = ptls_buffer__do_pushv
                                        ((ptls_buffer_t *)0x1,in_stack_fffffffffffffc10,
                                         in_stack_fffffffffffffc08);
                      if (iVar1 != 0) {
                        return iVar1;
                      }
                      iVar1 = ptls_buffer_reserve(in_stack_fffffffffffffc18,
                                                  (size_t)in_stack_fffffffffffffc10);
                      if (iVar1 != 0) {
                        return iVar1;
                      }
                      puVar2 = ptls_encode_quicint(in_stack_fffffffffffffc10,
                                                   in_stack_fffffffffffffc08);
                      in_RDI[2] = (long)puVar2 - *in_RDI;
                      iVar1 = ptls_buffer__adjust_quic_blocksize
                                        (buf_00,(size_t)in_stack_fffffffffffffc20);
                      if (iVar1 != 0) {
                        return iVar1;
                      }
                    }
                    if (in_stack_00000008 != 0) {
                      iVar1 = ptls_buffer_reserve(in_stack_fffffffffffffc18,
                                                  (size_t)in_stack_fffffffffffffc10);
                      if (iVar1 != 0) {
                        return iVar1;
                      }
                      puVar2 = ptls_encode_quicint(in_stack_fffffffffffffc10,
                                                   in_stack_fffffffffffffc08);
                      in_RDI[2] = (long)puVar2 - *in_RDI;
                      delta = in_RDI;
                      iVar1 = ptls_buffer__do_pushv(in_stack_fffffffffffffc18,in_RDI,1);
                      if (iVar1 != 0) {
                        return iVar1;
                      }
                      iVar1 = ptls_buffer_reserve(in_stack_fffffffffffffc18,(size_t)delta);
                      if (iVar1 != 0) {
                        return iVar1;
                      }
                      memset((void *)(*in_RDI + in_RDI[2]),0,in_stack_00000008);
                      in_RDI[2] = in_stack_00000008 + in_RDI[2];
                      iVar1 = ptls_buffer__adjust_quic_blocksize
                                        (buf_00,(size_t)in_stack_fffffffffffffc20);
                      if (iVar1 != 0) {
                        return iVar1;
                      }
                    }
                    local_34 = 0;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_34;
}

Assistant:

int quicly_encode_transport_parameter_list(ptls_buffer_t *buf, const quicly_transport_parameters_t *params,
                                           const quicly_cid_t *original_dcid, const quicly_cid_t *initial_scid,
                                           const quicly_cid_t *retry_scid, const void *stateless_reset_token, size_t expand_by)
{
    int ret;

#define PUSH_TP(buf, id, block)                                                                                                    \
    do {                                                                                                                           \
        ptls_buffer_push_quicint((buf), (id));                                                                                     \
        ptls_buffer_push_block((buf), -1, block);                                                                                  \
    } while (0)

    PUSH_TP(buf, QUICLY_TRANSPORT_PARAMETER_ID_MAX_UDP_PAYLOAD_SIZE,
            { ptls_buffer_push_quicint(buf, params->max_udp_payload_size); });
    if (params->max_stream_data.bidi_local != 0)
        PUSH_TP(buf, QUICLY_TRANSPORT_PARAMETER_ID_INITIAL_MAX_STREAM_DATA_BIDI_LOCAL,
                { ptls_buffer_push_quicint(buf, params->max_stream_data.bidi_local); });
    if (params->max_stream_data.bidi_remote != 0)
        PUSH_TP(buf, QUICLY_TRANSPORT_PARAMETER_ID_INITIAL_MAX_STREAM_DATA_BIDI_REMOTE,
                { ptls_buffer_push_quicint(buf, params->max_stream_data.bidi_remote); });
    if (params->max_stream_data.uni != 0)
        PUSH_TP(buf, QUICLY_TRANSPORT_PARAMETER_ID_INITIAL_MAX_STREAM_DATA_UNI,
                { ptls_buffer_push_quicint(buf, params->max_stream_data.uni); });
    if (params->max_data != 0)
        PUSH_TP(buf, QUICLY_TRANSPORT_PARAMETER_ID_INITIAL_MAX_DATA, { ptls_buffer_push_quicint(buf, params->max_data); });
    if (params->max_idle_timeout != 0)
        PUSH_TP(buf, QUICLY_TRANSPORT_PARAMETER_ID_MAX_IDLE_TIMEOUT, { ptls_buffer_push_quicint(buf, params->max_idle_timeout); });
    if (original_dcid != NULL)
        PUSH_TP(buf, QUICLY_TRANSPORT_PARAMETER_ID_ORIGINAL_CONNECTION_ID,
                { ptls_buffer_pushv(buf, original_dcid->cid, original_dcid->len); });
    if (initial_scid != NULL)
        PUSH_TP(buf, QUICLY_TRANSPORT_PARAMETER_ID_INITIAL_SOURCE_CONNECTION_ID,
                { ptls_buffer_pushv(buf, initial_scid->cid, initial_scid->len); });
    if (retry_scid != NULL)
        PUSH_TP(buf, QUICLY_TRANSPORT_PARAMETER_ID_RETRY_SOURCE_CONNECTION_ID,
                { ptls_buffer_pushv(buf, retry_scid->cid, retry_scid->len); });
    if (stateless_reset_token != NULL)
        PUSH_TP(buf, QUICLY_TRANSPORT_PARAMETER_ID_STATELESS_RESET_TOKEN,
                { ptls_buffer_pushv(buf, stateless_reset_token, QUICLY_STATELESS_RESET_TOKEN_LEN); });
    if (params->max_streams_bidi != 0)
        PUSH_TP(buf, QUICLY_TRANSPORT_PARAMETER_ID_INITIAL_MAX_STREAMS_BIDI,
                { ptls_buffer_push_quicint(buf, params->max_streams_bidi); });
    if (params->max_streams_uni != 0)
        PUSH_TP(buf, QUICLY_TRANSPORT_PARAMETER_ID_INITIAL_MAX_STREAMS_UNI,
                { ptls_buffer_push_quicint(buf, params->max_streams_uni); });
    if (QUICLY_LOCAL_ACK_DELAY_EXPONENT != QUICLY_DEFAULT_ACK_DELAY_EXPONENT)
        PUSH_TP(buf, QUICLY_TRANSPORT_PARAMETER_ID_ACK_DELAY_EXPONENT,
                { ptls_buffer_push_quicint(buf, QUICLY_LOCAL_ACK_DELAY_EXPONENT); });
    if (QUICLY_LOCAL_MAX_ACK_DELAY != QUICLY_DEFAULT_MAX_ACK_DELAY)
        PUSH_TP(buf, QUICLY_TRANSPORT_PARAMETER_ID_MAX_ACK_DELAY, { ptls_buffer_push_quicint(buf, QUICLY_LOCAL_MAX_ACK_DELAY); });
    if (params->min_ack_delay_usec != UINT64_MAX) {
        /* TODO consider the value we should advertise. */
        PUSH_TP(buf, QUICLY_TRANSPORT_PARAMETER_ID_MIN_ACK_DELAY,
                { ptls_buffer_push_quicint(buf, QUICLY_LOCAL_MAX_ACK_DELAY * 1000 /* in microseconds */); });
    }
    if (params->disable_active_migration)
        PUSH_TP(buf, QUICLY_TRANSPORT_PARAMETER_ID_DISABLE_ACTIVE_MIGRATION, {});
    if (QUICLY_LOCAL_ACTIVE_CONNECTION_ID_LIMIT != QUICLY_DEFAULT_ACTIVE_CONNECTION_ID_LIMIT)
        PUSH_TP(buf, QUICLY_TRANSPORT_PARAMETER_ID_ACTIVE_CONNECTION_ID_LIMIT,
                { ptls_buffer_push_quicint(buf, QUICLY_LOCAL_ACTIVE_CONNECTION_ID_LIMIT); });
    if (params->max_datagram_frame_size != 0)
        PUSH_TP(buf, QUICLY_TRANSPORT_PARAMETER_ID_MAX_DATAGRAM_FRAME_SIZE,
                { ptls_buffer_push_quicint(buf, params->max_datagram_frame_size); });
    /* if requested, add a greasing TP of 1 MTU size so that CH spans across multiple packets */
    if (expand_by != 0) {
        PUSH_TP(buf, 31 * 100 + 27, {
            if ((ret = ptls_buffer_reserve(buf, expand_by)) != 0)
                goto Exit;
            memset(buf->base + buf->off, 0, expand_by);
            buf->off += expand_by;
        });
    }

#undef PUSH_TP

    ret = 0;
Exit:
    return ret;
}